

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int scheduler_can_send(quicly_conn_t *conn)

{
  long *in_RDI;
  int conn_is_saturated;
  int local_4;
  
  if ((*(uint *)(in_RDI + 1) & 0xfffffffd) == 0) {
    if (in_RDI[0xa8] == 0) {
      local_4 = 0;
    }
    else {
      local_4 = (*(code *)**(undefined8 **)(*in_RDI + 0xb8))
                          (*(undefined8 *)(*in_RDI + 0xb8),in_RDI,
                           ((ulong)in_RDI[0xd3] < (ulong)in_RDI[0xd2] ^ 0xffU) & 1);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int scheduler_can_send(quicly_conn_t *conn)
{
    /* invoke the scheduler only when we are able to send stream data; skipping STATE_ACCEPTING is important as the application
     * would not have setup data pointer. */
    switch (conn->super.state) {
    case QUICLY_STATE_FIRSTFLIGHT:
    case QUICLY_STATE_CONNECTED:
        break;
    default:
        return 0;
    }

    /* scheduler would never have data to send, until application keys become available */
    if (conn->application == NULL)
        return 0;

    int conn_is_saturated = !(conn->egress.max_data.sent < conn->egress.max_data.permitted);
    return conn->super.ctx->stream_scheduler->can_send(conn->super.ctx->stream_scheduler, conn, conn_is_saturated);
}